

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O3

int near_capacity(void)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  
  iVar1 = inv_weight();
  if (iVar1 < 1) {
    iVar3 = 0;
  }
  else {
    iVar3 = 5;
    if (1 < wc) {
      uVar2 = (uint)(iVar1 * 2) / (uint)wc;
      uVar4 = 4;
      if (uVar2 < 4) {
        uVar4 = uVar2;
      }
      iVar3 = uVar4 + 1;
    }
  }
  return iVar3;
}

Assistant:

int near_capacity(void)
{
    return calc_capacity(0);
}